

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LNode.h
# Opt level: O0

void __thiscall
LNodeData<LNodeFCStmt>::LNodeData(LNodeData<LNodeFCStmt> *this,LNodeType type,LNodeFCStmt *value)

{
  LNodeFCStmt *value_local;
  LNodeType type_local;
  LNodeData<LNodeFCStmt> *this_local;
  
  LNode::LNode(&this->super_LNode,type);
  (this->super_LNode)._vptr_LNode = (_func_int **)&PTR__LNodeData_00156ac8;
  memset(&this->value,0,0x30);
  LNodeFCStmt::LNodeFCStmt(&this->value);
  LNodeFCStmt::operator=(&this->value,value);
  return;
}

Assistant:

LNodeData(LNodeType type, T &&value) : LNode(type) {
        this->value = std::move(value);
    }